

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraphFlattener::convertMultiLevelInstances
          (SceneGraphFlattener *this,Ref<embree::SceneGraph::Node> *node)

{
  bool bVar1;
  Node *pNVar2;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *pvVar3;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_RSI;
  Node *in_RDI;
  GroupNode *new_node;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  group;
  Ref<embree::SceneGraph::Node> *in_stack_00000260;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_00000268;
  SceneGraphFlattener *in_stack_00000270;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_stack_ffffffffffffff28;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_ffffffffffffff38;
  Node *pNVar4;
  GroupNode *in_stack_ffffffffffffff40;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *this_00;
  Node *__k;
  _Self local_58;
  _Self local_50 [4];
  mapped_type *local_30;
  Node *local_20;
  Node *local_10;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *local_8;
  
  __k = in_RDI;
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x2c803a);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::operator!=(local_50,&local_58);
  if (bVar1) {
    local_30 = std::
               map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[](in_RSI,(key_type *)__k);
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)local_30->ptr;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
  }
  else {
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::vector((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
              *)0x2c80e1);
    convertMultiLevelInstances(in_stack_00000270,in_stack_00000268,in_stack_00000260);
    pNVar2 = (Node *)::operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    pNVar4 = pNVar2;
    pvVar3 = (vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
              *)std::
                map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                ::operator[](in_RSI,(key_type *)__k);
    this_00 = pvVar3;
    local_10 = pNVar4;
    local_8 = pvVar3;
    if (pNVar4 != (Node *)0x0) {
      (*(pNVar4->super_RefCount)._vptr_RefCount[2])();
    }
    if ((Node *)(pvVar3->
                super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                )._M_impl.super__Vector_impl_data._M_start != (Node *)0x0) {
      (*(((Node *)(pvVar3->
                  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->super_RefCount)._vptr_RefCount[3])();
    }
    (pvVar3->
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)local_10;
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pNVar2;
    local_20 = pNVar2;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::~vector(this_00);
  }
  return (Ref<embree::SceneGraph::Node>)__k;
}

Assistant:

Ref<SceneGraph::Node> convertMultiLevelInstances(const Ref<SceneGraph::Node>& node)
    {
      if (object_mapping.find(node) != object_mapping.end()) {
        return object_mapping[node];
      }
      
      std::vector<Ref<SceneGraph::Node>> group;
      convertMultiLevelInstances(group,node);
      auto new_node = new SceneGraph::GroupNode(group);
      object_mapping[node] = new_node;
      return new_node;
    }